

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager.cc
# Opt level: O2

void __thiscall MemoryManager::free(MemoryManager *this,void *__ptr)

{
  list<const_Node_*,_std::allocator<const_Node_*>_> *this_00;
  long *plVar1;
  Node *this_01;
  _List_node_base *p_Var2;
  MemoryManager *pMVar3;
  
  pMVar3 = this;
  while (pMVar3 = (MemoryManager *)
                  (pMVar3->operations).
                  super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>._M_impl.
                  _M_node.super__List_node_base._M_next, pMVar3 != this) {
    plVar1 = (long *)(pMVar3->operations).
                     super__List_base<const_Operation_*,_std::allocator<const_Operation_*>_>._M_impl
                     ._M_node._M_size;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  this_00 = &this->nodes;
  p_Var2 = (_List_node_base *)this_00;
  while (p_Var2 = (((_List_base<const_Node_*,_std::allocator<const_Node_*>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)this_00) {
    this_01 = (Node *)p_Var2[1]._M_next;
    if (this_01 != (Node *)0x0) {
      Node::~Node(this_01);
    }
    operator_delete(this_01,0x40);
  }
  std::__cxx11::list<const_Operation_*,_std::allocator<const_Operation_*>_>::clear
            (&this->operations);
  std::__cxx11::list<const_Node_*,_std::allocator<const_Node_*>_>::clear(this_00);
  return;
}

Assistant:

void MemoryManager::free()
{
	for_each(operations.begin(), operations.end(), delete_ptr<Operation>());
	for_each(nodes.begin(), nodes.end(), delete_ptr<Node>());
	operations.clear();
	nodes.clear();
}